

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_11::VersionEditPrinter
          (anon_unknown_11 *this,uint64_t pos,Slice record,WritableFile *dst)

{
  Status s;
  Status local_120;
  string r;
  string local_f8;
  Slice record_local;
  VersionEdit edit;
  
  record_local.size_ = (size_t)record.data_;
  record_local.data_ = (char *)pos;
  std::__cxx11::string::string((string *)&r,"--- offset ",(allocator *)&edit);
  AppendNumberTo(&r,(uint64_t)this);
  std::__cxx11::string::append((char *)&r);
  VersionEdit::VersionEdit(&edit);
  VersionEdit::DecodeFrom((VersionEdit *)&s,(Slice *)&edit);
  if (s.state_ == (char *)0x0) {
    VersionEdit::DebugString_abi_cxx11_(&local_f8,&edit);
    std::__cxx11::string::append((string *)&r);
    std::__cxx11::string::_M_dispose();
  }
  else {
    Status::ToString_abi_cxx11_(&local_f8,&s);
    std::__cxx11::string::append((string *)&r);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::push_back((char)&r);
  }
  local_f8._M_dataplus._M_p._0_4_ = r._M_dataplus._M_p._0_4_;
  local_f8._M_dataplus._M_p._4_4_ = r._M_dataplus._M_p._4_4_;
  local_f8._M_string_length._0_4_ = (undefined4)r._M_string_length;
  local_f8._M_string_length._4_4_ = r._M_string_length._4_4_;
  (**(code **)(*(long *)record.size_ + 0x10))(&local_120,(long *)record.size_);
  Status::~Status(&local_120);
  Status::~Status(&s);
  VersionEdit::~VersionEdit(&edit);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

static void VersionEditPrinter(uint64_t pos, Slice record, WritableFile* dst) {
  std::string r = "--- offset ";
  AppendNumberTo(&r, pos);
  r += "; ";
  VersionEdit edit;
  Status s = edit.DecodeFrom(record);
  if (!s.ok()) {
    r += s.ToString();
    r.push_back('\n');
  } else {
    r += edit.DebugString();
  }
  dst->Append(r);
}